

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_huffman_decode_int0(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  cram_huffman_code *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  pcVar1 = (c->field_6).huffman.codes;
  uVar3 = 0;
  uVar2 = (ulong)(uint)*out_size;
  if (*out_size < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    *(int32_t *)(out + uVar3 * 4) = pcVar1->symbol;
  }
  return 0;
}

Assistant:

int cram_huffman_decode_int0(cram_slice *slice, cram_codec *c,
			     cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;
    const cram_huffman_code * const codes = c->huffman.codes;

    /* Special case of 0 length codes */
    for (i = 0, n = *out_size; i < n; i++) {
	out_i[i] = codes[0].symbol;
    }
    return 0;
}